

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dag.cpp
# Opt level: O0

bool __thiscall DAGPropagator::propagateNewEdge(DAGPropagator *this,int e)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  vector<DAGPropagator::TrailedSuccList,_std::allocator<DAGPropagator::TrailedSuccList>_> *this_00;
  pair<int,_int> *ppVar4;
  reference piVar5;
  undefined4 in_ESI;
  long *in_RDI;
  const_iterator cVar6;
  Iterator<const_std::pair<int,_int>_> o;
  int i;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  int n;
  const_iterator succ_taile;
  int in_stack_000000b8;
  int in_stack_000000bc;
  DAGPropagator *in_stack_000000c0;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  GraphPropagator *in_stack_ffffffffffffff50;
  GraphPropagator *this_01;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  reference local_78;
  int local_6c;
  TrailedConstantAccessList<std::pair<int,_int>,_Tint> *local_68;
  int local_60;
  TrailedConstantAccessList<std::pair<int,_int>,_Tint> *local_58;
  int local_50;
  reference local_48;
  TrailedConstantAccessList<std::pair<int,_int>,_Tint> *local_38;
  int local_30;
  int in_stack_ffffffffffffffd4;
  DReachabilityPropagator *in_stack_ffffffffffffffd8;
  bool local_1;
  
  bVar1 = DReachabilityPropagator::propagateNewEdge
                    (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  if (bVar1) {
    uVar3 = (**(code **)(*in_RDI + 0xc0))(in_RDI,in_ESI);
    if ((uVar3 & 1) == 0) {
      local_1 = false;
    }
    else {
      this_00 = (vector<DAGPropagator::TrailedSuccList,_std::allocator<DAGPropagator::TrailedSuccList>_>
                 *)(in_RDI + 0x39);
      iVar2 = GraphPropagator::getTail(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      std::vector<DAGPropagator::TrailedSuccList,_std::allocator<DAGPropagator::TrailedSuccList>_>::
      operator[](this_00,(long)iVar2);
      cVar6 = TrailedConstantAccessList<std::pair<int,_int>,_Tint>::end
                        ((TrailedConstantAccessList<std::pair<int,_int>,_Tint> *)
                         in_stack_ffffffffffffff50);
      local_38 = cVar6.l;
      local_30 = cVar6.i;
      GraphPropagator::getTail(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      GraphPropagator::getHead(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      connectTo(in_stack_000000c0,in_stack_000000bc,in_stack_000000b8);
      local_48 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)
                            CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                            (size_type)in_RDI);
      std::_Bit_reference::operator=(&local_48,true);
      while( true ) {
        this_01 = (GraphPropagator *)(in_RDI + 0x39);
        iVar2 = GraphPropagator::getTail(this_01,in_stack_ffffffffffffff4c);
        std::vector<DAGPropagator::TrailedSuccList,_std::allocator<DAGPropagator::TrailedSuccList>_>
        ::operator[]((vector<DAGPropagator::TrailedSuccList,_std::allocator<DAGPropagator::TrailedSuccList>_>
                      *)this_01,(long)iVar2);
        cVar6 = TrailedConstantAccessList<std::pair<int,_int>,_Tint>::end
                          ((TrailedConstantAccessList<std::pair<int,_int>,_Tint> *)this_01);
        local_68 = cVar6.l;
        local_60 = cVar6.i;
        o._12_4_ = 0;
        o.l = (TrailedConstantAccessList<std::pair<int,_int>,_Tint> *)SUB128(cVar6._0_12_,0);
        o.i = SUB124(cVar6._0_12_,8);
        local_58 = local_68;
        local_50 = local_60;
        bVar1 = TrailedConstantAccessList<std::pair<int,_int>,_Tint>::
                Iterator<const_std::pair<int,_int>_>::operator!=
                          ((Iterator<const_std::pair<int,_int>_> *)&stack0xffffffffffffffd8,o);
        if (!bVar1) break;
        ppVar4 = TrailedConstantAccessList<std::pair<int,_int>,_Tint>::
                 Iterator<const_std::pair<int,_int>_>::operator*
                           ((Iterator<const_std::pair<int,_int>_> *)0x20bc6a);
        local_6c = ppVar4->first;
        local_78 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)(in_RDI + 0x36),(long)local_6c);
        local_80._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)
                               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        std::vector<int,_std::allocator<int>_>::end
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             this_01,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                      *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48
                                                ));
          if (!bVar1) break;
          piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_80);
          (**(code **)(*in_RDI + 200))(in_RDI,*piVar5);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_80);
        }
        TrailedConstantAccessList<std::pair<int,_int>,_Tint>::Iterator<const_std::pair<int,_int>_>::
        operator++((Iterator<const_std::pair<int,_int>_> *)&stack0xffffffffffffffd8,0);
      }
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool DAGPropagator::propagateNewEdge(int e) {
	if (!DReachabilityPropagator::propagateNewEdge(e)) {
		return false;
	}

	if (!check_cycle(e)) {
		return false;
	}

	TrailedSuccList::const_iterator succ_taile = succs[getTail(e)].end();
	connectTo(getTail(e), getHead(e));
	processed_e[e] = true;

	// Only checking the new ones
	for (; succ_taile != succs[getTail(e)].end(); succ_taile++) {
		const int n = (*succ_taile).first;
		for (const int i : ou[n]) {
			prevent_cycle(i);
		}
	}
	/*
	//Check all reachable
	for (int n = 0; n < nbNodes(); n++) {
			if (reachable(n,getTail(e))) {
					for (int i = 0; i < in[n].size(); i++) {
							assert(!prevent_cycle(in[n][i])); //Assert because already checked before
					}
			}
	}
	*/

	/*    cout <<"Start "<<e<<endl;
	for (int i = 0; i < nbNodes(); i++) {
			for (int j = 0; j < nbNodes(); j++) {
					cout << reachability[i][j]<<",";
			}
			cout <<endl;
			}*/

	return true;
}